

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

void * ON_BinarySearchArrayFirstUnsignedInt
                 (uint key,void *base,size_t count,size_t sizeof_element,size_t key_offset)

{
  uint uVar1;
  size_t sVar2;
  uint d;
  size_t i;
  uchar *a;
  void *rc;
  size_t key_offset_local;
  size_t sizeof_element_local;
  size_t count_local;
  void *base_local;
  uint key_local;
  
  a = (uchar *)0x0;
  if ((((count != 0) && (base != (void *)0x0)) && (key_offset + 4 <= sizeof_element)) &&
     (i = key_offset + (long)base, sVar2 = count, key <= *(uint *)(i + (count - 1) * sizeof_element)
     )) {
    while (sizeof_element_local = sVar2, sizeof_element_local != 0) {
      sVar2 = sizeof_element_local >> 1;
      uVar1 = *(uint *)(i + sVar2 * sizeof_element);
      if (uVar1 <= key) {
        if (uVar1 < key) {
          sVar2 = sVar2 + 1;
          i = sVar2 * sizeof_element + i;
        }
        else {
          a = (uchar *)(i + (sVar2 * sizeof_element - key_offset));
          if (sVar2 == 0) {
            return a;
          }
        }
        sizeof_element_local = sizeof_element_local - sVar2;
        sVar2 = sizeof_element_local;
      }
    }
  }
  return a;
}

Assistant:

const void* ON_BinarySearchArrayFirstUnsignedInt(
  unsigned int key,
  const void* base,
  size_t count,
  size_t sizeof_element,
  size_t key_offset
)
{
  void* rc = nullptr;

  if (count > 0 && nullptr != base && key_offset + sizeof(key) <= sizeof_element)
  {
    const unsigned char* a = (const unsigned char*)base;
    a += key_offset;

    size_t i;
    unsigned int d = *((const unsigned int*)(a + (count - 1) * sizeof_element));
    if (key <= d)
    {
      while (count > 0)
      {
        i = count / 2;
        d = *((const unsigned int*)(a + i * sizeof_element));
        if (key < d)
        {
          count = i;
        }
        else if (key > d)
        {
          i++;
          a += (i * sizeof_element);
          count -= i;
        }
        else
        {
          rc = (void*)(a + ((i * sizeof_element) - key_offset));
          if (i == 0) break;
          count -= i;
        }
      }
    }
  }
  return rc;
}